

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O2

void append_one(bson *bs,lua_State *L,char *key,size_t sz)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  lua_Integer v;
  size_t sVar5;
  int *__src;
  long lVar6;
  long lVar7;
  int32_t v_00;
  _Bool isarray;
  size_t sz_00;
  size_t len;
  lua_Number local_40;
  size_t len_1;
  
  iVar2 = lua_type(L,-1);
  switch(iVar2) {
  case 1:
    append_key(bs,8,key,sz);
    iVar2 = lua_toboolean(L,-1);
    write_byte(bs,(uint8_t)iVar2);
    return;
  default:
    pcVar4 = lua_typename(L,iVar2);
    luaL_error(L,"Invalid value type : %s",pcVar4);
    return;
  case 3:
    iVar2 = lua_isinteger(L,-1);
    if (iVar2 == 0) {
      local_40 = lua_tonumberx(L,-1,(int *)0x0);
      append_key(bs,1,key,sz);
      write_double(bs,local_40);
      return;
    }
    v = lua_tointegerx(L,-1,(int *)0x0);
    if ((int)v == v) {
      append_key(bs,0x10,key,sz);
      write_int32(bs,(int)v);
      return;
    }
    append_key(bs,0x12,key,sz);
    write_int64(bs,v);
    return;
  case 4:
    break;
  case 5:
    sVar5 = lua_rawlen(L,-1);
    iVar2 = 3;
    if (sVar5 != 0) {
      lua_pushinteger(L,sVar5);
      iVar3 = lua_next(L,-2);
      if (iVar3 == 0) {
        isarray = true;
        iVar2 = 4;
        goto LAB_00118b7a;
      }
      lua_settop(L,-3);
    }
    isarray = false;
LAB_00118b7a:
    append_key(bs,iVar2,key,sz);
    pack_dict(L,bs,isarray);
    return;
  case 7:
    append_key(bs,3,key,sz);
    __src = (int *)lua_touserdata(L,-1);
    iVar2 = *__src;
    bson_reserve(bs,iVar2);
    memcpy(bs->ptr + bs->size,__src,(long)iVar2);
    bs->size = bs->size + iVar2;
    return;
  }
  pcVar4 = lua_tolstring(L,-1,&len);
  if ((len < 2) || (*pcVar4 != '\0')) {
    pcVar4 = lua_tolstring(L,-1,&len_1);
    append_key(bs,2,key,sz);
    iVar2 = reserve_length(bs);
    write_string(bs,pcVar4,CONCAT44(len_1._4_4_,(int)len_1));
    v_00 = (int)len_1 + 1;
LAB_00118a14:
    write_length(bs,v_00,iVar2);
  }
  else {
    bVar1 = pcVar4[1];
    append_key(bs,(uint)bVar1,key,sz);
    switch(bVar1) {
    case 5:
      iVar2 = reserve_length(bs);
      iVar3 = (int)(len - 2);
      bson_reserve(bs,iVar3);
      memcpy(bs->ptr + bs->size,pcVar4 + 2,len - 2);
      bs->size = bs->size + iVar3;
      v_00 = (int)len + -3;
      goto LAB_00118a14;
    case 7:
      if (len != 0xe) {
        luaL_error(L,"Invalid object id %s",pcVar4 + 2);
      }
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
      bson_reserve(bs,(int)len + -2);
      memcpy(bs->ptr + bs->size,pcVar4 + 2,len - 2);
      bs->size = (int)len + bs->size + -2;
      break;
    case 9:
      if (len != 6) {
        luaL_error(L,"Invalid date");
      }
      write_int64(bs,(ulong)*(uint *)(pcVar4 + 2) * 1000);
      break;
    case 10:
      break;
    case 0xb:
      sVar5 = len - 3;
      for (lVar6 = 0; 3 - len != lVar6; lVar6 = lVar6 + -1) {
        if (pcVar4[lVar6 + (len - 2)] == '\0') {
          lVar7 = lVar6 + -1;
          sz_00 = -lVar6;
          goto LAB_00118d49;
        }
      }
      lVar7 = 2 - len;
      sz_00 = sVar5;
LAB_00118d49:
      len = sVar5;
      write_string(bs,pcVar4 + 2,sVar5 + lVar7);
      write_string(bs,pcVar4 + 2 + (len - sz_00),sz_00);
      break;
    case 0x11:
      if (len != 10) {
        luaL_error(L,"Invalid timestamp");
      }
      write_int32(bs,*(int32_t *)(pcVar4 + 2));
      write_int32(bs,*(int32_t *)(pcVar4 + 6));
      break;
    default:
      if (bVar1 == 0x7f) {
        return;
      }
      if (bVar1 == 0xff) {
        return;
      }
    case 6:
    case 8:
    case 0x10:
      luaL_error(L,"Invalid subtype %d",(ulong)(uint)bVar1);
    }
  }
  return;
}

Assistant:

static void
append_one(struct bson *bs, lua_State *L, const char *key, size_t sz) {
	int vt = lua_type(L,-1);
	switch(vt) {
	case LUA_TNUMBER:
		append_number(bs, L, key, sz);
		break;
	case LUA_TUSERDATA: {
		append_key(bs, BSON_DOCUMENT, key, sz);
		int32_t * doc = lua_touserdata(L,-1);
		int32_t sz = *doc;
		bson_reserve(bs,sz);
		memcpy(bs->ptr + bs->size, doc, sz);
		bs->size += sz;
		break;
	}
	case LUA_TSTRING: {
		size_t len;
		const char * str = lua_tolstring(L,-1,&len);
		if (len > 1 && str[0]==0) {
			int subt = (uint8_t)str[1];
			append_key(bs, subt, key, sz);
			switch(subt) {
			case BSON_BINARY:
				write_binary(bs, str+2, len-2);
				break;
			case BSON_OBJECTID:
				if (len != 2+12) {
					luaL_error(L, "Invalid object id %s", str+2);
				}
				// go though
			case BSON_JSCODE:
			case BSON_DBPOINTER:
			case BSON_SYMBOL:
			case BSON_CODEWS:
				bson_reserve(bs,len-2);
				memcpy(bs->ptr + bs->size, str+2, len-2);
				bs->size += len-2;
				break;
			case BSON_DATE: {
				if (len != 2+4) {
					luaL_error(L, "Invalid date");
				}
				const uint32_t * ts = (const uint32_t *)(str + 2);
				int64_t v = (int64_t)*ts * 1000;
				write_int64(bs, v);
				break;
			}
			case BSON_TIMESTAMP: {
				if (len != 2+8) {
					luaL_error(L, "Invalid timestamp");
				}
				const uint32_t * inc = (const uint32_t *)(str + 2);
				const uint32_t * ts = (const uint32_t *)(str + 6);
				write_int32(bs, *inc);
				write_int32(bs, *ts);
				break;
			}
			case BSON_REGEX: {
				str+=2;
				len-=3;
				size_t i;
				for (i=0;i<len;i++) {
					if (str[len-i-1]==0) {
						break;
					}
				}
				write_string(bs, str, len-i-1);
				write_string(bs, str + len-i, i);
				break;
			}
			case BSON_MINKEY:
			case BSON_MAXKEY:
			case BSON_NULL:
				break;
			default:
				luaL_error(L,"Invalid subtype %d", subt);
			}
		} else {
			size_t len;
			const char * str = lua_tolstring(L,-1,&len);
			append_key(bs, BSON_STRING, key, sz);
			int off = reserve_length(bs);
			write_string(bs, str, len);
			write_length(bs, len+1, off);		
		}
		break;
	}
	case LUA_TTABLE:
		append_table(bs, L, key, sz);
		break;
	case LUA_TBOOLEAN:
		append_key(bs, BSON_BOOLEAN, key, sz);
		write_byte(bs, lua_toboolean(L,-1));
		break;
	default:
		luaL_error(L, "Invalid value type : %s", lua_typename(L,vt));
	}
}